

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpunsafe.c
# Opt level: O1

mp_int * mp_unsafe_copy(mp_int *x)

{
  mp_int *dest;
  ulong nw;
  
  nw = x->nw;
  if (1 < nw) {
    do {
      if (x->w[nw - 1] != 0) goto LAB_001182ec;
      nw = nw - 1;
    } while (1 < nw);
    nw = 1;
  }
LAB_001182ec:
  dest = mp_make_sized(nw);
  mp_copy_into(dest,x);
  return dest;
}

Assistant:

mp_int *mp_unsafe_copy(mp_int *x)
{
    mp_int *copy = mp_make_sized(mp_unsafe_words_needed(x));
    mp_copy_into(copy, x);
    return copy;
}